

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O1

int non_temporal_setup(ptls_aead_context_t *_ctx,int is_enc,void *key,void *iv,size_t key_size)

{
  int iVar1;
  size_t capacity;
  ptls_fusion_aesgcm_context_t *ppVar2;
  code *pcVar3;
  uint uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  
  iVar1 = ptls_fusion_can_aesni256;
  ppVar2 = (ptls_fusion_aesgcm_context_t *)(ulong)(uint)ptls_fusion_can_aesni256;
  bVar5 = ptls_fusion_can_aesni256 != 0;
  uVar4 = (uint)iv & 0xfff;
  if ((uVar4 < 0xff1) || (0xff4 < uVar4)) {
    auVar6 = *iv;
  }
  else {
    auVar6 = vpshufb_avx(*(undefined1 (*) [16])((ulong)iv & 0xfffffffffffffff0),
                         *(undefined1 (*) [16])("" + ((uint)iv & 0xf)));
  }
  auVar6 = vpshufb_avx(auVar6,_DAT_00131c70);
  _ctx[1].do_get_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)auVar6._0_8_;
  _ctx[1].do_set_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)auVar6._8_8_;
  if (key != (void *)0x0) {
    _ctx->dispose_crypto = aesgcm_dispose_crypto;
    _ctx->do_get_iv = aesgcm_get_iv;
    _ctx->do_set_iv = aesgcm_set_iv;
    _ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    if (is_enc == 0) {
      _ctx->do_encrypt =
           (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
            *)0x0;
      _ctx->do_encrypt_v =
           (_func_void_st_ptls_aead_context_t_ptr_void_ptr_ptls_iovec_t_ptr_size_t_uint64_t_void_ptr_size_t
            *)0x0;
      _ctx->do_decrypt = non_temporal_decrypt128;
    }
    else {
      _ctx->do_encrypt = ptls_aead__do_encrypt;
      pcVar3 = non_temporal_encrypt_v128;
      if (is_enc != 0 && bVar5) {
        pcVar3 = non_temporal_encrypt_v256;
      }
      _ctx->do_encrypt_v = pcVar3;
      _ctx->do_decrypt =
           (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
            *)0x0;
    }
    capacity = 0xe0;
    if (iVar1 == 0) {
      capacity = 0x70;
    }
    ppVar2 = new_aesgcm(key,key_size,capacity,(uint)(is_enc != 0 && bVar5));
    _ctx[1].algo = (st_ptls_aead_algorithm_t *)ppVar2;
  }
  return (int)ppVar2;
}

Assistant:

static int non_temporal_setup(ptls_aead_context_t *_ctx, int is_enc, const void *key, const void *iv, size_t key_size)
{
    struct aesgcm_context *ctx = (struct aesgcm_context *)_ctx;
    int aesni256 = is_enc && ptls_fusion_can_aesni256;

    ctx->static_iv = loadn128(iv, PTLS_AESGCM_IV_SIZE);
    ctx->static_iv = _mm_shuffle_epi8(ctx->static_iv, byteswap128);
    if (key == NULL)
        return 0;

    ctx->super.dispose_crypto = aesgcm_dispose_crypto;
    ctx->super.do_get_iv = aesgcm_get_iv;
    ctx->super.do_set_iv = aesgcm_set_iv;
    ctx->super.do_encrypt_init = NULL;
    ctx->super.do_encrypt_update = NULL;
    ctx->super.do_encrypt_final = NULL;
    if (is_enc) {
        ctx->super.do_encrypt = ptls_aead__do_encrypt;
        ctx->super.do_encrypt_v = aesni256 ? non_temporal_encrypt_v256 : non_temporal_encrypt_v128;
        ctx->super.do_decrypt = NULL;
    } else {
        assert(!aesni256);
        ctx->super.do_encrypt = NULL;
        ctx->super.do_encrypt_v = NULL;
        ctx->super.do_decrypt = non_temporal_decrypt128;
    }

    ctx->aesgcm =
        new_aesgcm(key, key_size,
                   7 * (ptls_fusion_can_aesni256 ? 32 : 16), // 6 blocks at once, plus len(A) | len(C) that we might append
                   aesni256);

    return 0;
}